

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTExecutionInfo.cpp
# Opt level: O0

bool __thiscall
TTD::ExecutionInfoManager::GetPreviousTimeAndPositionForDebugger
          (ExecutionInfoManager *this,TTDebuggerSourceLocation *sourceLocation)

{
  uint startOffset_00;
  SingleCallCounter *pSVar1;
  LONG local_9c;
  uint32 startOffset;
  LONG srcColumn;
  ULONG srcLine;
  bool hasCaller;
  SingleCallCounter cfinfoCaller;
  uint64 ltime;
  uint64 ftime;
  FunctionBody *pFStack_30;
  int32 statementIndex;
  FunctionBody *fbody;
  SingleCallCounter *cfinfo;
  bool noPrevious;
  TTDebuggerSourceLocation *sourceLocation_local;
  ExecutionInfoManager *this_local;
  
  cfinfo._7_1_ = false;
  pSVar1 = GetTopCallCounter(this);
  cfinfoCaller.CurrentStatementBytecodeMin = 0;
  cfinfoCaller.CurrentStatementBytecodeMax = 0;
  if (pSVar1->LastStatementIndex == -1) {
    memset(&srcLine,0,0x48);
    srcColumn._3_1_ = TryGetTopCallCallerCounter(this,(SingleCallCounter *)&srcLine);
    cfinfo._7_1_ = !(bool)srcColumn._3_1_;
    if (cfinfo._7_1_) {
      ltime = pSVar1->FunctionTime;
      cfinfoCaller._64_8_ = pSVar1->CurrentStatementLoopTime;
      pFStack_30 = pSVar1->Function;
      ftime._4_4_ = pSVar1->CurrentStatementIndex;
    }
    else {
      ltime = (uint64)cfinfoCaller.Name;
      cfinfoCaller.CurrentStatementBytecodeMin = cfinfoCaller.CurrentStatementIndex;
      cfinfoCaller.CurrentStatementBytecodeMax = cfinfoCaller._52_4_;
      pFStack_30 = _srcLine;
      ftime._4_4_ = (uint)cfinfoCaller.LastStatementLoopTime;
    }
  }
  else {
    ltime = pSVar1->FunctionTime;
    cfinfoCaller._64_8_ = pSVar1->LastStatementLoopTime;
    pFStack_30 = pSVar1->Function;
    ftime._4_4_ = pSVar1->LastStatementIndex;
  }
  startOffset = 0;
  local_9c = -1;
  startOffset_00 = Js::FunctionBody::GetStatementStartOffset(pFStack_30,ftime._4_4_);
  Js::FunctionBody::GetSourceLineFromStartOffset_TTD
            (pFStack_30,startOffset_00,&startOffset,&local_9c);
  TTDebuggerSourceLocation::SetLocationFull
            (sourceLocation,this->m_topLevelCallbackEventTime,ltime,cfinfoCaller._64_8_,pFStack_30,
             startOffset,local_9c);
  return cfinfo._7_1_;
}

Assistant:

bool ExecutionInfoManager::GetPreviousTimeAndPositionForDebugger(TTDebuggerSourceLocation& sourceLocation) const
    {
        bool noPrevious = false;
        const SingleCallCounter& cfinfo = this->GetTopCallCounter();

        //if we are at the first statement in the function then we want the parents current
        Js::FunctionBody* fbody = nullptr;
        int32 statementIndex = -1;
        uint64 ftime = 0;
        uint64 ltime = 0;
        if(cfinfo.LastStatementIndex == -1)
        {
            SingleCallCounter cfinfoCaller = { 0 };
            bool hasCaller = this->TryGetTopCallCallerCounter(cfinfoCaller);
            if (hasCaller)
            {
                ftime = cfinfoCaller.FunctionTime;
                ltime = cfinfoCaller.CurrentStatementLoopTime;

                fbody = cfinfoCaller.Function;
                statementIndex = cfinfoCaller.CurrentStatementIndex;
            }
            else
            {
                //Set the position info to the current statement and return true
                noPrevious = true;

                ftime = cfinfo.FunctionTime;
                ltime = cfinfo.CurrentStatementLoopTime;

                fbody = cfinfo.Function;
                statementIndex = cfinfo.CurrentStatementIndex;
            }
        }
        else
        {
            ftime = cfinfo.FunctionTime;
            ltime = cfinfo.LastStatementLoopTime;

            fbody = cfinfo.Function;
            statementIndex = cfinfo.LastStatementIndex;
        }

        ULONG srcLine = 0;
        LONG srcColumn = -1;
        uint32 startOffset = fbody->GetStatementStartOffset(statementIndex);
        fbody->GetSourceLineFromStartOffset_TTD(startOffset, &srcLine, &srcColumn);

        sourceLocation.SetLocationFull(this->m_topLevelCallbackEventTime, ftime, ltime, fbody, srcLine, srcColumn);

        return noPrevious;
    }